

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

LIBSSH2_LISTENER *
libssh2_channel_forward_listen_ex
          (LIBSSH2_SESSION *session,char *host,int port,int *bound_port,int queue_maxsize)

{
  bool bVar1;
  int iVar2;
  time_t start_time;
  size_t sVar3;
  uchar *puVar4;
  char *pcVar5;
  uint32_t uVar6;
  char *__s;
  uchar *s;
  uchar *data;
  int local_54;
  ulong local_50;
  list_head *local_48;
  int *local_40;
  packet_requirev_state_t *local_38;
  
  if (session == (LIBSSH2_SESSION *)0x0) {
    host = (char *)0x0;
  }
  else {
    local_54 = queue_maxsize;
    local_40 = bound_port;
    start_time = time((time_t *)0x0);
    __s = "0.0.0.0";
    if (host != (char *)0x0) {
      __s = host;
    }
    local_38 = &session->fwdLstn_packet_requirev_state;
    local_48 = &session->listeners;
    do {
      if (session->fwdLstn_state == libssh2_NB_state_idle) {
        sVar3 = strlen(__s);
        session->fwdLstn_host_len = (uint32_t)sVar3;
        uVar6 = (uint32_t)sVar3 + 0x1b;
        session->fwdLstn_packet_len = uVar6;
        (session->fwdLstn_packet_requirev_state).start = 0;
        puVar4 = (uchar *)(*session->alloc)((size_t)uVar6,&session->abstract);
        session->fwdLstn_packet = puVar4;
        if (puVar4 != (uchar *)0x0) {
          s = puVar4 + 1;
          *puVar4 = 'P';
          _libssh2_store_str(&s,"tcpip-forward",0xd);
          *s = '\x01';
          s = s + 1;
          _libssh2_store_str(&s,__s,(ulong)session->fwdLstn_host_len);
          _libssh2_store_u32(&s,port);
          session->fwdLstn_state = libssh2_NB_state_created;
          goto LAB_0010a37c;
        }
        iVar2 = -6;
        pcVar5 = "Unable to allocate memory for setenv packet";
        s = (uchar *)0x0;
LAB_0010a554:
        _libssh2_error(session,iVar2,pcVar5);
LAB_0010a5a5:
        host = (char *)0x0;
      }
      else {
LAB_0010a37c:
        if (session->fwdLstn_state == libssh2_NB_state_created) {
          iVar2 = _libssh2_transport_send
                            (session,session->fwdLstn_packet,(ulong)session->fwdLstn_packet_len,
                             (uchar *)0x0,0);
          if (iVar2 == 0) {
            (*session->free)(session->fwdLstn_packet,&session->abstract);
            session->fwdLstn_packet = (uchar *)0x0;
            session->fwdLstn_state = libssh2_NB_state_sent;
            goto LAB_0010a3e6;
          }
          if (iVar2 == -0x25) {
            iVar2 = -0x25;
            pcVar5 = "Would block sending global-request packet for forward listen request";
            goto LAB_0010a554;
          }
          _libssh2_error(session,-7,
                         "Unable to send global-request packet for forward listen request");
          (*session->free)(session->fwdLstn_packet,&session->abstract);
          session->fwdLstn_packet = (uchar *)0x0;
LAB_0010a59a:
          session->fwdLstn_state = libssh2_NB_state_idle;
          goto LAB_0010a5a5;
        }
LAB_0010a3e6:
        if (session->fwdLstn_state != libssh2_NB_state_sent) goto LAB_0010a59a;
        iVar2 = _libssh2_packet_requirev(session,"QR",&data,&local_50,0,(uchar *)0x0,0,local_38);
        if (iVar2 == -0x25) {
          _libssh2_error(session,-0x25,"Would block");
LAB_0010a592:
          host = (char *)0x0;
LAB_0010a594:
          bVar1 = false;
        }
        else {
          if ((iVar2 != 0) || (local_50 == 0)) {
            iVar2 = -0xe;
            pcVar5 = "Unknown";
LAB_0010a582:
            _libssh2_error(session,iVar2,pcVar5);
            session->fwdLstn_state = libssh2_NB_state_idle;
            goto LAB_0010a592;
          }
          if (*data == 'R') {
            (*session->free)(data,&session->abstract);
            iVar2 = -0x20;
            pcVar5 = "Unable to complete request for forward-listen";
            goto LAB_0010a582;
          }
          bVar1 = true;
          if (*data == 'Q') {
            host = (char *)_libssh2_calloc(session,0x60);
            if ((LIBSSH2_LISTENER *)host == (LIBSSH2_LISTENER *)0x0) {
              _libssh2_error(session,-6,"Unable to allocate memory for listener queue");
LAB_0010a610:
              host = (char *)0x0;
            }
            else {
              pcVar5 = (char *)(*session->alloc)((long)session->fwdLstn_host_len + 1,
                                                 &session->abstract);
              ((LIBSSH2_LISTENER *)host)->host = pcVar5;
              if (pcVar5 == (char *)0x0) {
                _libssh2_error(session,-6,"Unable to allocate memory for listener queue");
                (*session->free)(host,&session->abstract);
                goto LAB_0010a610;
              }
              ((LIBSSH2_LISTENER *)host)->session = session;
              memcpy(pcVar5,__s,(ulong)session->fwdLstn_host_len);
              ((LIBSSH2_LISTENER *)host)->host[session->fwdLstn_host_len] = '\0';
              uVar6 = port;
              if ((port == 0) && (4 < local_50)) {
                uVar6 = _libssh2_ntohu32(data + 1);
              }
              ((LIBSSH2_LISTENER *)host)->port = uVar6;
              ((LIBSSH2_LISTENER *)host)->queue_size = 0;
              ((LIBSSH2_LISTENER *)host)->queue_maxsize = local_54;
              _libssh2_list_add(local_48,(list_node *)host);
              if (local_40 != (int *)0x0) {
                *local_40 = ((LIBSSH2_LISTENER *)host)->port;
              }
            }
            (*session->free)(data,&session->abstract);
            session->fwdLstn_state = libssh2_NB_state_idle;
            goto LAB_0010a594;
          }
        }
        if (bVar1) goto LAB_0010a59a;
      }
    } while (((((LIBSSH2_LISTENER *)host == (LIBSSH2_LISTENER *)0x0) &&
              (session->api_block_mode != 0)) &&
             (iVar2 = libssh2_session_last_errno(session), iVar2 == -0x25)) &&
            (iVar2 = _libssh2_wait_socket(session,start_time), iVar2 == 0));
  }
  return (LIBSSH2_LISTENER *)host;
}

Assistant:

LIBSSH2_API LIBSSH2_LISTENER *
libssh2_channel_forward_listen_ex(LIBSSH2_SESSION *session, const char *host,
                                  int port, int *bound_port, int queue_maxsize)
{
    LIBSSH2_LISTENER *ptr;

    if(!session)
        return NULL;

    BLOCK_ADJUST_ERRNO(ptr, session,
                       channel_forward_listen(session, host, port, bound_port,
                                              queue_maxsize));
    return ptr;
}